

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CropResizeLayerParams::SharedDtor(CropResizeLayerParams *this)

{
  ulong uVar1;
  SamplingMode *this_00;
  BoxCoordinatesMode *this_01;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x76ac);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  if (this != (CropResizeLayerParams *)_CropResizeLayerParams_default_instance_) {
    this_00 = this->mode_;
    if (this_00 != (SamplingMode *)0x0) {
      SamplingMode::~SamplingMode(this_00);
    }
    operator_delete(this_00,0x18);
    this_01 = this->boxindicesmode_;
    if (this_01 != (BoxCoordinatesMode *)0x0) {
      BoxCoordinatesMode::~BoxCoordinatesMode(this_01);
    }
    operator_delete(this_01,0x18);
  }
  return;
}

Assistant:

inline void CropResizeLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete mode_;
  if (this != internal_default_instance()) delete boxindicesmode_;
}